

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkpoint_manager.cpp
# Opt level: O3

void __thiscall
duckdb::CheckpointReader::ReadSequence
          (CheckpointReader *this,CatalogTransaction transaction,Deserializer *deserializer)

{
  int iVar1;
  CreateSequenceInfo *info;
  unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> ptr;
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> local_28;
  CreateInfo *local_20;
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,100,"sequence");
  local_28._M_head_impl = (CreateInfo *)0x0;
  iVar1 = (*deserializer->_vptr_Deserializer[10])(deserializer);
  if ((char)iVar1 != '\0') {
    (*deserializer->_vptr_Deserializer[6])(deserializer);
    CreateInfo::Deserialize((CreateInfo *)&stack0xffffffffffffffe0,deserializer);
    local_28._M_head_impl = local_20;
    (*deserializer->_vptr_Deserializer[7])(deserializer);
  }
  (*deserializer->_vptr_Deserializer[0xb])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  info = (CreateSequenceInfo *)
         unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                   ((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *
                    )&local_28);
  Catalog::CreateSequence(this->catalog,transaction,info);
  if (local_28._M_head_impl != (CreateInfo *)0x0) {
    (*((local_28._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
  }
  return;
}

Assistant:

void CheckpointReader::ReadSequence(CatalogTransaction transaction, Deserializer &deserializer) {
	auto info = deserializer.ReadProperty<unique_ptr<CreateInfo>>(100, "sequence");
	auto &sequence_info = info->Cast<CreateSequenceInfo>();
	catalog.CreateSequence(transaction, sequence_info);
}